

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandSeqSweep2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  uint local_ec;
  int c;
  int nConstrs;
  Ssw_Pars_t *pPars;
  Ssw_Pars_t Pars;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_ec = 0;
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  Ssw_ManSetDefaultParams((Ssw_Pars_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_002873be:
  iVar1 = Extra_UtilGetopt(argc,argv,"PQFCLSIVMNcmplkodsefqvwh");
  if (iVar1 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      return 1;
    }
    iVar1 = Abc_NtkIsComb(pNtk_00);
    if (iVar1 != 0) {
      Abc_Print(0,"The network is combinational (run \"fraig\" or \"fraig_sweep\").\n");
      return 0;
    }
    iVar1 = Abc_NtkIsStrash(pNtk_00);
    if (iVar1 == 0) {
      Abc_Print(0,"This command works only for structrally hashed networks. Run \"st\".\n");
      return 0;
    }
    iVar1 = Abc_NtkPiNum(pNtk_00);
    if (iVar1 != 0) {
      if (0 < (int)local_ec) {
        iVar1 = Abc_NtkConstrNum(pNtk_00);
        if (0 < iVar1) {
          uVar2 = Abc_NtkConstrNum(pNtk_00);
          Abc_Print(-1,"The network already has %d constraints.\n",(ulong)uVar2);
          return 0;
        }
        Abc_Print(0,"Setting the number of constraints to be %d.\n",(ulong)local_ec);
        pNtk_00->nConstrs = local_ec;
      }
      if (Pars.nFramesK != 0) {
        iVar1 = Abc_NtkConstrNum(pNtk_00);
        iVar3 = Abc_NtkPoNum(pNtk_00);
        if (iVar1 == iVar3) {
          Abc_Print(0,
                    "Command cannot be applied because the network has only constraint outputs (no primary outputs).\n"
                   );
          return 0;
        }
        iVar1 = Abc_NtkConstrNum(pNtk_00);
        if (iVar1 < 1) {
          Abc_Print(0,"Performing constraint-based scorr without constraints.\n");
          Pars.nFramesK = 0;
        }
        else {
          uVar2 = Abc_NtkConstrNum(pNtk_00);
          Abc_Print(0,"Performing scorr with %d constraints.\n",(ulong)uVar2);
        }
      }
      if ((Pars.fVerbose != 0) && (Pars.fFlopVerbose != 0)) {
        Abc_Print(0,"Command line switches \'-e\' and \'-f\' cannot be used at the same time.\n");
        return 0;
      }
      Pars.pFunc = Abc_NtkDarSeqSweep2(pNtk_00,(Ssw_Pars_t *)&pPars);
      if ((Abc_Ntk_t *)Pars.pFunc == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Sequential sweeping has failed.\n");
        return 1;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,(Abc_Ntk_t *)Pars.pFunc);
      return 0;
    }
    Abc_Print(0,"This command works only for designs with primary inputs.\n");
    return 0;
  }
  switch(iVar1) {
  case 0x43:
    if (globalUtilOptind < argc) {
      Pars.fMergeFull = atoi(argv[globalUtilOptind]);
      iVar1 = Pars.fMergeFull;
      goto joined_r0x0028764d;
    }
    Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
    goto LAB_00287be1;
  default:
    goto LAB_00287be1;
  case 0x46:
    if (globalUtilOptind < argc) {
      Pars.nPartSize = atoi(argv[globalUtilOptind]);
      iVar1 = Pars.nPartSize;
      goto joined_r0x0028764d;
    }
    Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
    goto LAB_00287be1;
  case 0x49:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
      goto LAB_00287be1;
    }
    Pars.nBTLimitGlobal = atoi(argv[globalUtilOptind]);
    uVar2 = Pars.nBTLimitGlobal;
    break;
  case 0x4c:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
      goto LAB_00287be1;
    }
    Pars.fConstrs = atoi(argv[globalUtilOptind]);
    iVar1 = Pars.fConstrs;
joined_r0x0028764d:
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 1) goto LAB_00287be1;
    goto LAB_002873be;
  case 0x4d:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
      goto LAB_00287be1;
    }
    Pars.nRecycleCalls = atoi(argv[globalUtilOptind]);
    uVar2 = Pars.nRecycleCalls;
    break;
  case 0x4e:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
      goto LAB_00287be1;
    }
    local_ec = atoi(argv[globalUtilOptind]);
    uVar2 = local_ec;
    break;
  case 0x50:
    if (globalUtilOptind < argc) goto LAB_00287438;
    Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
    goto LAB_00287be1;
  case 0x51:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-Q\" should be followed by an integer.\n");
      goto LAB_00287be1;
    }
    pPars._4_4_ = atoi(argv[globalUtilOptind]);
    uVar2 = pPars._4_4_;
    break;
  case 0x53:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
      goto LAB_00287be1;
    }
    Pars.nOverSize = atoi(argv[globalUtilOptind]);
    uVar2 = Pars.nOverSize;
    break;
  case 0x56:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-V\" should be followed by an integer.\n");
      goto LAB_00287be1;
    }
    Pars.nSatVarMax = atoi(argv[globalUtilOptind]);
    uVar2 = Pars.nSatVarMax;
    break;
  case 99:
    Pars.nFramesK = Pars.nFramesK ^ 1;
    goto LAB_002873be;
  case 100:
    Pars.fOutputCorr = Pars.fOutputCorr ^ 1;
    goto LAB_002873be;
  case 0x65:
    Pars.fVerbose = Pars.fVerbose ^ 1;
    goto LAB_002873be;
  case 0x66:
    Pars.fFlopVerbose = Pars.fFlopVerbose ^ 1;
    goto LAB_002873be;
  case 0x68:
    goto LAB_00287be1;
  case 0x6b:
    Pars.fPolarFlip = Pars.fPolarFlip ^ 1;
    goto LAB_002873be;
  case 0x6c:
    Pars.TimeLimit = Pars.TimeLimit ^ 1;
    goto LAB_002873be;
  case 0x6d:
    Pars.nFramesAddSim = Pars.nFramesAddSim ^ 1;
    goto LAB_002873be;
  case 0x6f:
    Pars.fLatchCorr = Pars.fLatchCorr ^ 1;
    goto LAB_002873be;
  case 0x70:
    Pars.nStepsMax = Pars.nStepsMax ^ 1;
    goto LAB_002873be;
  case 0x71:
    Pars.fEquivDump = Pars.fEquivDump ^ 1;
    goto LAB_002873be;
  case 0x73:
    Pars.fSemiFormal = Pars.fSemiFormal ^ 1;
    goto LAB_002873be;
  case 0x76:
    Pars.fScorrGia = Pars.fScorrGia ^ 1;
    goto LAB_002873be;
  case 0x77:
    Pars.fUseCSat = Pars.fUseCSat ^ 1;
    goto LAB_002873be;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if ((int)uVar2 < 0) goto LAB_00287be1;
  goto LAB_002873be;
LAB_00287438:
  pPars._0_4_ = atoi(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if ((int)(uint)pPars < 2) {
LAB_00287be1:
    Abc_Print(-2,"usage: scorr [-PQFCLSIVMN <num>] [-cmplkodsefqvwh]\n");
    Abc_Print(-2,"\t         performs sequential sweep using K-step induction\n");
    Abc_Print(-2,"\t-P num : max partition size (0 = no partitioning) [default = %d]\n",
              (ulong)(uint)pPars);
    Abc_Print(-2,"\t-Q num : partition overlap (0 = no overlap) [default = %d]\n",(ulong)pPars._4_4_
             );
    Abc_Print(-2,"\t-F num : number of time frames for induction (1=simple) [default = %d]\n",
              (ulong)(uint)Pars.nPartSize);
    Abc_Print(-2,"\t-C num : max number of conflicts at a node (0=inifinite) [default = %d]\n",
              (ulong)(uint)Pars.fMergeFull);
    Abc_Print(-2,"\t-L num : max number of levels to consider (0=all) [default = %d]\n",
              (ulong)(uint)Pars.fConstrs);
    Abc_Print(-2,"\t-N num : number of last POs treated as constraints (0=none) [default = %d]\n",
              (ulong)(uint)Pars.nFramesK);
    Abc_Print(-2,"\t-S num : additional simulation frames for c-examples (0=none) [default = %d]\n",
              (ulong)(uint)Pars.nOverSize);
    Abc_Print(-2,
              "\t-I num : iteration number to stop and output SR-model (-1=none) [default = %d]\n",
              (ulong)(uint)Pars.nBTLimitGlobal);
    Abc_Print(-2,"\t-V num : min var num needed to recycle the SAT solver [default = %d]\n",
              (ulong)(uint)Pars.nSatVarMax);
    Abc_Print(-2,"\t-M num : min call num needed to recycle the SAT solver [default = %d]\n",
              (ulong)(uint)Pars.nRecycleCalls);
    Abc_Print(-2,"\t-N num : set last <num> POs to be constraints (use with -c) [default = %d]\n",
              (ulong)local_ec);
    pcVar4 = "no";
    if (Pars.nFramesK != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-c     : toggle using explicit constraints [default = %s]\n",pcVar4);
    pcVar4 = "no";
    if (Pars.nFramesAddSim != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-m     : toggle full merge if constraints are present [default = %s]\n",pcVar4);
    pcVar4 = "no";
    if (Pars.nStepsMax != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-p     : toggle aligning polarity of SAT variables [default = %s]\n",pcVar4);
    pcVar4 = "no";
    if (Pars.TimeLimit != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-l     : toggle doing latch correspondence [default = %s]\n",pcVar4);
    pcVar4 = "no";
    if (Pars.fPolarFlip != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-k     : toggle doing constant correspondence [default = %s]\n",pcVar4);
    pcVar4 = "no";
    if (Pars.fLatchCorr != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-o     : toggle doing \'PO correspondence\' [default = %s]\n",pcVar4);
    pcVar4 = "no";
    if (Pars.fOutputCorr != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-d     : toggle dynamic addition of constraints [default = %s]\n",pcVar4);
    pcVar4 = "no";
    if (Pars.fSemiFormal != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-s     : toggle local simulation in the cone of influence [default = %s]\n",
              pcVar4);
    pcVar4 = "no";
    if (Pars.fVerbose != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-e     : toggle dumping disproved internal equivalences [default = %s]\n",pcVar4
             );
    pcVar4 = "no";
    if (Pars.fFlopVerbose != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-f     : toggle dumping proved internal equivalences [default = %s]\n",pcVar4);
    pcVar4 = "no";
    if (Pars.fEquivDump != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-q     : toggle quitting when PO is not a constant candidate [default = %s]\n",
              pcVar4);
    pcVar4 = "no";
    if (Pars.fUseCSat != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-w     : toggle printout of flop equivalences [default = %s]\n",pcVar4);
    pcVar4 = "no";
    if (Pars.fScorrGia != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar4);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    return 1;
  }
  goto LAB_002873be;
}

Assistant:

int Abc_CommandSeqSweep2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    Ssw_Pars_t Pars, * pPars = &Pars;
    int nConstrs = 0;
    int c;
    extern Abc_Ntk_t * Abc_NtkDarSeqSweep2( Abc_Ntk_t * pNtk, Ssw_Pars_t * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Ssw_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PQFCLSIVMNcmplkodsefqvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nPartSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nPartSize < 2 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nOverSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nOverSize < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesK = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesK <= 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit <= 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMaxLevs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMaxLevs <= 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesAddSim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesAddSim < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nItersStop = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nItersStop < 0 )
                goto usage;
            break;
        case 'V':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-V\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nSatVarMax2 = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nSatVarMax2 < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRecycleCalls2 = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRecycleCalls2 < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nConstrs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConstrs < 0 )
                goto usage;
            break;
        case 'c':
            pPars->fConstrs ^= 1;
            break;
        case 'm':
            pPars->fMergeFull ^= 1;
            break;
        case 'p':
            pPars->fPolarFlip ^= 1;
            break;
        case 'l':
            pPars->fLatchCorr ^= 1;
            break;
        case 'k':
            pPars->fConstCorr ^= 1;
            break;
        case 'o':
            pPars->fOutputCorr ^= 1;
            break;
//        case 'f':
//            pPars->fSemiFormal ^= 1;
//            break;
        case 'd':
            pPars->fDynamic ^= 1;
            break;
        case 's':
            pPars->fLocalSim ^= 1;
            break;
        case 'e':
            pPars->fEquivDump ^= 1;
            break;
        case 'f':
            pPars->fEquivDump2 ^= 1;
            break;
        case 'q':
            pPars->fStopWhenGone ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fFlopVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( 0, "The network is combinational (run \"fraig\" or \"fraig_sweep\").\n" );
        return 0;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( 0, "This command works only for structrally hashed networks. Run \"st\".\n" );
        return 0;
    }

    if ( Abc_NtkPiNum(pNtk) == 0 )
    {
        Abc_Print( 0, "This command works only for designs with primary inputs.\n" );
        return 0;
    }

    // if constraints are to be used, network should have no constraints
    if ( nConstrs > 0 )
    {
        if ( Abc_NtkConstrNum(pNtk) > 0 )
        {
            Abc_Print( -1, "The network already has %d constraints.\n", Abc_NtkConstrNum(pNtk) );
            return 0;
        }
        else
        {
            Abc_Print( 0, "Setting the number of constraints to be %d.\n", nConstrs );
            pNtk->nConstrs = nConstrs;
        }
    }

    if ( pPars->fConstrs )
    {
        if ( Abc_NtkConstrNum(pNtk) == Abc_NtkPoNum(pNtk) )
        {
            Abc_Print( 0, "Command cannot be applied because the network has only constraint outputs (no primary outputs).\n" );
            return 0;
        }
        if ( Abc_NtkConstrNum(pNtk) > 0 )
            Abc_Print( 0, "Performing scorr with %d constraints.\n", Abc_NtkConstrNum(pNtk) );
        else
        {
            Abc_Print( 0, "Performing constraint-based scorr without constraints.\n" );
            pPars->fConstrs = 0;
        }
    }
    if ( pPars->fEquivDump && pPars->fEquivDump2 )
    {
        Abc_Print( 0, "Command line switches \'-e\' and \'-f\' cannot be used at the same time.\n" );
        return 0;
    }

    // get the new network
    pNtkRes = Abc_NtkDarSeqSweep2( pNtk, pPars );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Sequential sweeping has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: scorr [-PQFCLSIVMN <num>] [-cmplkodsefqvwh]\n" );
    Abc_Print( -2, "\t         performs sequential sweep using K-step induction\n" );
    Abc_Print( -2, "\t-P num : max partition size (0 = no partitioning) [default = %d]\n", pPars->nPartSize );
    Abc_Print( -2, "\t-Q num : partition overlap (0 = no overlap) [default = %d]\n", pPars->nOverSize );
    Abc_Print( -2, "\t-F num : number of time frames for induction (1=simple) [default = %d]\n", pPars->nFramesK );
    Abc_Print( -2, "\t-C num : max number of conflicts at a node (0=inifinite) [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-L num : max number of levels to consider (0=all) [default = %d]\n", pPars->nMaxLevs );
    Abc_Print( -2, "\t-N num : number of last POs treated as constraints (0=none) [default = %d]\n", pPars->fConstrs );
    Abc_Print( -2, "\t-S num : additional simulation frames for c-examples (0=none) [default = %d]\n", pPars->nFramesAddSim );
    Abc_Print( -2, "\t-I num : iteration number to stop and output SR-model (-1=none) [default = %d]\n", pPars->nItersStop );
    Abc_Print( -2, "\t-V num : min var num needed to recycle the SAT solver [default = %d]\n", pPars->nSatVarMax2 );
    Abc_Print( -2, "\t-M num : min call num needed to recycle the SAT solver [default = %d]\n", pPars->nRecycleCalls2 );
    Abc_Print( -2, "\t-N num : set last <num> POs to be constraints (use with -c) [default = %d]\n", nConstrs );
    Abc_Print( -2, "\t-c     : toggle using explicit constraints [default = %s]\n", pPars->fConstrs? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle full merge if constraints are present [default = %s]\n", pPars->fMergeFull? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle aligning polarity of SAT variables [default = %s]\n", pPars->fPolarFlip? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle doing latch correspondence [default = %s]\n", pPars->fLatchCorr? "yes": "no" );
    Abc_Print( -2, "\t-k     : toggle doing constant correspondence [default = %s]\n", pPars->fConstCorr? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle doing \'PO correspondence\' [default = %s]\n", pPars->fOutputCorr? "yes": "no" );
//    Abc_Print( -2, "\t-f     : toggle filtering using iterative BMC [default = %s]\n", pPars->fSemiFormal? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dynamic addition of constraints [default = %s]\n", pPars->fDynamic? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle local simulation in the cone of influence [default = %s]\n", pPars->fLocalSim? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle dumping disproved internal equivalences [default = %s]\n", pPars->fEquivDump? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle dumping proved internal equivalences [default = %s]\n", pPars->fEquivDump2? "yes": "no" );
    Abc_Print( -2, "\t-q     : toggle quitting when PO is not a constant candidate [default = %s]\n", pPars->fStopWhenGone? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printout of flop equivalences [default = %s]\n", pPars->fFlopVerbose? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}